

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

void TTD::NSSnapValues::ParseTopLevelEvalFunctionBodyInfo
               (TopLevelEvalFunctionBodyResolveInfo *fbInfo,bool readSeparator,
               ThreadContext *threadContext,FileReader *reader,SlabAllocator *alloc)

{
  int iVar1;
  uint64 uVar2;
  
  ParseTopLevelCommonBodyResolveInfo
            (&fbInfo->TopLevelBase,readSeparator,false,threadContext,reader,alloc);
  uVar2 = FileReader::ReadUInt64(reader,u64Val,true);
  fbInfo->EvalFlags = uVar2;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  fbInfo->RegisterDocument = SUB41(iVar1,0);
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  fbInfo->IsIndirect = SUB41(iVar1,0);
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  fbInfo->IsStrictMode = SUB41(iVar1,0);
  (*reader->_vptr_FileReader[7])(reader);
  return;
}

Assistant:

void ParseTopLevelEvalFunctionBodyInfo(TopLevelEvalFunctionBodyResolveInfo* fbInfo, bool readSeparator, ThreadContext* threadContext, FileReader* reader, SlabAllocator& alloc)
        {
            NSSnapValues::ParseTopLevelCommonBodyResolveInfo(&fbInfo->TopLevelBase, readSeparator, false, threadContext, reader, alloc);

            fbInfo->EvalFlags = reader->ReadUInt64(NSTokens::Key::u64Val, true);
            fbInfo->RegisterDocument = reader->ReadBool(NSTokens::Key::boolVal, true);
            fbInfo->IsIndirect = reader->ReadBool(NSTokens::Key::boolVal, true);
            fbInfo->IsStrictMode = reader->ReadBool(NSTokens::Key::boolVal, true);
            reader->ReadRecordEnd();
        }